

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

int __thiscall ON_MaterialRef::Compare(ON_MaterialRef *this,ON_MaterialRef *other)

{
  int iVar1;
  int iVar2;
  
  iVar1 = ON_UuidCompare(&this->m_plugin_id,&other->m_plugin_id);
  iVar2 = (uint)this->m_material_source - (uint)other->m_material_source;
  if (iVar1 == 0) {
    iVar2 = 0;
  }
  if (iVar2 == 0) {
    iVar2 = ON_UuidCompare(&this->m_material_id,&other->m_material_id);
  }
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = ON_UuidCompare(&this->m_material_backface_id,&other->m_material_backface_id);
  return iVar2;
}

Assistant:

int ON_MaterialRef::Compare( const ON_MaterialRef& other ) const
{
  int rc = ON_UuidCompare(m_plugin_id,other.m_plugin_id);
  if (rc)
    rc = ((int)m_material_source) - ((int)other.m_material_source);
  if (!rc)
    rc = ON_UuidCompare(m_material_id,other.m_material_id);
  if (!rc)
    rc = ON_UuidCompare(m_material_backface_id,other.m_material_backface_id);
  return rc;
}